

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  FILE *__stream;
  undefined8 uVar1;
  ostream *local_1d0;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream aoStack_198 [376];
  FILE *local_20;
  FILE *xmlout;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites_local;
  XmlUnitTestResultPrinter *this_local;
  
  xmlout = (FILE *)test_suites;
  test_suites_local = (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)this;
  local_20 = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1d0 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a8) {
    local_1d0 = aoStack_198;
  }
  PrintXmlTestsList(local_1d0,
                    (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)xmlout);
  __stream = local_20;
  StringStreamToString(&local_1c8,(stringstream *)local_1a8);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  fclose(local_20);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestSuite*>& test_suites) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_suites);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}